

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysutil.c
# Opt level: O0

int read_timeout(int fd,uint wait_seconds)

{
  int *piVar1;
  bool bVar2;
  fd_set *__arr;
  undefined1 auStack_a8 [4];
  uint __i;
  timeval timeout;
  fd_set read_fdset;
  int ret;
  uint wait_seconds_local;
  int fd_local;
  
  read_fdset.__fds_bits[0xf]._4_4_ = 0;
  if (wait_seconds != 0) {
    for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
      read_fdset.__fds_bits[(ulong)__arr._4_4_ - 1] = 0;
    }
    read_fdset.__fds_bits[(long)(fd / 0x40) + -1] =
         1L << ((byte)((long)fd % 0x40) & 0x3f) | read_fdset.__fds_bits[(long)(fd / 0x40) + -1];
    _auStack_a8 = (ulong)wait_seconds;
    timeout.tv_sec = 0;
    do {
      read_fdset.__fds_bits[0xf]._4_4_ =
           select(fd + 1,(fd_set *)&timeout.tv_usec,(fd_set *)0x0,(fd_set *)0x0,
                  (timeval *)auStack_a8);
      bVar2 = false;
      if (read_fdset.__fds_bits[0xf]._4_4_ < 0) {
        piVar1 = __errno_location();
        bVar2 = *piVar1 == 4;
      }
    } while (bVar2);
    if (read_fdset.__fds_bits[0xf]._4_4_ == 0) {
      read_fdset.__fds_bits[0xf]._4_4_ = -1;
      piVar1 = __errno_location();
      *piVar1 = 0x6e;
    }
    else if (read_fdset.__fds_bits[0xf]._4_4_ == 1) {
      read_fdset.__fds_bits[0xf]._4_4_ = 0;
    }
  }
  return read_fdset.__fds_bits[0xf]._4_4_;
}

Assistant:

int read_timeout(int fd, unsigned int wait_seconds) {
  int ret = 0;
  if (wait_seconds > 0) {
    fd_set read_fdset;
    struct timeval timeout;

    FD_ZERO(&read_fdset);
    FD_SET(fd, &read_fdset);

    timeout.tv_sec = wait_seconds;
    timeout.tv_usec = 0;
    do {
      ret = select(fd + 1, &read_fdset, NULL, NULL, &timeout);
    } while (ret < 0 && errno == EINTR);

    if (ret == 0) {
      ret = -1;
      errno = ETIMEDOUT;
    } else if (ret == 1)
      ret = 0;
  }

  return ret;
}